

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_load_extension(sqlite3 *db,char *zFile,char *zProc,char **pzErrMsg)

{
  ulong uVar1;
  byte bVar2;
  sqlite3_vfs *psVar3;
  char **ppcVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  void *pvVar9;
  _func_void *p_Var10;
  size_t sVar11;
  ulong uVar12;
  byte *pbVar13;
  void **__s;
  uint uVar14;
  u64 uVar15;
  long lVar16;
  uint uVar17;
  char *local_58;
  sqlite3 *local_50;
  size_t local_48;
  char **local_40;
  char *local_38;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  psVar3 = db->pVfs;
  local_58 = (char *)0x0;
  local_48 = strlen(zFile);
  if (pzErrMsg != (char **)0x0) {
    *pzErrMsg = (char *)0x0;
  }
  if ((db->flags & 0x10000) == 0) {
    iVar6 = 1;
    bVar5 = true;
    if (pzErrMsg != (char **)0x0) {
      pcVar8 = sqlite3_mprintf("not authorized");
      *pzErrMsg = pcVar8;
    }
  }
  else {
    local_38 = "sqlite3_extension_init";
    if (zProc != (char *)0x0) {
      local_38 = zProc;
    }
    if (local_48 - 0x1001 < 0xfffffffffffff000) {
LAB_00128635:
      iVar6 = 1;
      bVar5 = true;
      if (pzErrMsg != (char **)0x0) {
        uVar15 = local_48 + 300;
        iVar7 = sqlite3_initialize();
        if (iVar7 == 0) {
          local_58 = (char *)sqlite3Malloc(uVar15);
        }
        else {
          local_58 = (char *)0x0;
        }
        *pzErrMsg = local_58;
        if (local_58 != (char *)0x0) {
          sqlite3_snprintf((int)uVar15,local_58,"unable to open shared library [%.*s]",0x1000,zFile)
          ;
          (*psVar3->xDlError)(psVar3,(int)local_48 + 299,local_58);
        }
      }
    }
    else {
      local_50 = db;
      local_40 = pzErrMsg;
      pvVar9 = (*psVar3->xDlOpen)(psVar3,zFile);
      bVar5 = true;
      do {
        if ((!bVar5) || (pvVar9 != (void *)0x0)) {
          pzErrMsg = local_40;
          db = local_50;
          if (pvVar9 == (void *)0x0) goto LAB_00128635;
          p_Var10 = (*psVar3->xDlSym)(psVar3,pvVar9,local_38);
          uVar17 = 0;
          if (zProc != (char *)0x0 || p_Var10 != (_func_void *)0x0) {
            pcVar8 = (char *)0x0;
            db = local_50;
            goto LAB_00128899;
          }
          if (zFile != (char *)0x0) {
            sVar11 = strlen(zFile);
            uVar17 = (uint)sVar11 & 0x3fffffff;
          }
          iVar6 = sqlite3_initialize();
          if (iVar6 == 0) {
            pcVar8 = (char *)sqlite3Malloc((ulong)(uVar17 + 0x1e));
          }
          else {
            pcVar8 = (char *)0x0;
          }
          if (pcVar8 != (char *)0x0) {
            builtin_strncpy(pcVar8,"sqlite3_",8);
            uVar12 = (ulong)uVar17;
            goto LAB_001287cb;
          }
          (*psVar3->xDlClose)(psVar3,pvVar9);
          p_Var10 = (_func_void *)0x0;
          db = local_50;
          goto LAB_00128890;
        }
        pcVar8 = sqlite3_mprintf("%s.%s",zFile,"so");
        if (pcVar8 == (char *)0x0) {
          pvVar9 = (void *)0x0;
        }
        else {
          if (local_48 < 0xffe) {
            pvVar9 = (*psVar3->xDlOpen)(psVar3,pcVar8);
          }
          else {
            pvVar9 = (void *)0x0;
          }
          sqlite3_free(pcVar8);
        }
        bVar5 = false;
      } while (pcVar8 != (char *)0x0);
      iVar6 = 7;
      bVar5 = true;
      db = local_50;
    }
  }
  goto LAB_00128a42;
  while (uVar1 = uVar12 - 1, lVar16 = uVar12 - 1, uVar12 = uVar1, zFile[lVar16] != '/') {
LAB_001287cb:
    if ((long)uVar12 < 1) {
      uVar17 = 0;
      goto LAB_001287fc;
    }
  }
  uVar17 = (int)uVar1 + 1;
LAB_001287fc:
  iVar6 = sqlite3_strnicmp(zFile + uVar17,"lib",3);
  db = local_50;
  uVar14 = uVar17 + 3;
  if (iVar6 != 0) {
    uVar14 = uVar17;
  }
  iVar6 = 8;
  for (pbVar13 = (byte *)(zFile + (int)uVar14); (bVar2 = *pbVar13, bVar2 != 0 && (bVar2 != 0x2e));
      pbVar13 = pbVar13 + 1) {
    if ((""[bVar2] & 2) != 0) {
      lVar16 = (long)iVar6;
      iVar6 = iVar6 + 1;
      pcVar8[lVar16] = ""[(uint)(int)(char)bVar2];
    }
  }
  (pcVar8 + (long)iVar6 + 4)[0] = 't';
  (pcVar8 + (long)iVar6 + 4)[1] = '\0';
  builtin_strncpy(pcVar8 + iVar6,"_ini",4);
  p_Var10 = (*psVar3->xDlSym)(psVar3,pvVar9,pcVar8);
  local_38 = pcVar8;
LAB_00128890:
  if (pcVar8 == (char *)0x0) {
    iVar6 = 7;
  }
  else {
LAB_00128899:
    if (p_Var10 == (_func_void *)0x0) {
      if (local_40 != (char **)0x0) {
        sVar11 = strlen(local_38);
        uVar15 = local_48 + sVar11 + 300;
        iVar6 = sqlite3_initialize();
        if (iVar6 == 0) {
          local_58 = (char *)sqlite3Malloc(uVar15);
        }
        else {
          local_58 = (char *)0x0;
        }
        *local_40 = local_58;
        if (local_58 != (char *)0x0) {
          iVar6 = (int)uVar15;
          sqlite3_snprintf(iVar6,local_58,"no entry point [%s] in shared library [%s]",local_38,
                           zFile);
          (*psVar3->xDlError)(psVar3,iVar6 + -1,local_58);
        }
      }
      (*psVar3->xDlClose)(psVar3,pvVar9);
      sqlite3_free(pcVar8);
    }
    else {
      sqlite3_free(pcVar8);
      iVar7 = (*p_Var10)(db,&local_58,&sqlite3Apis);
      ppcVar4 = local_40;
      if (iVar7 == 0) {
        uVar15 = (long)db->nExtension * 8 + 8;
        __s = (void **)sqlite3DbMallocRawNN(db,uVar15);
        if (__s == (void **)0x0) {
          iVar6 = 7;
          bVar5 = true;
        }
        else {
          memset(__s,0,uVar15);
          if (0 < (long)db->nExtension) {
            memcpy(__s,db->aExtension,(long)db->nExtension << 3);
          }
          if (db->aExtension != (void **)0x0) {
            sqlite3DbFreeNN(db,db->aExtension);
          }
          db->aExtension = __s;
          iVar6 = db->nExtension;
          db->nExtension = iVar6 + 1;
          __s[iVar6] = pvVar9;
          bVar5 = false;
          iVar6 = 0;
        }
        goto LAB_00128a42;
      }
      bVar5 = false;
      iVar6 = 0;
      if (iVar7 == 0x100) goto LAB_00128a42;
      if (local_40 != (char **)0x0) {
        pcVar8 = sqlite3_mprintf("error during initialization: %s",local_58);
        *ppcVar4 = pcVar8;
      }
      sqlite3_free(local_58);
      (*psVar3->xDlClose)(psVar3,pvVar9);
    }
    iVar6 = 1;
  }
  bVar5 = true;
LAB_00128a42:
  if ((bVar5) || (iVar7 = 0, db->mallocFailed != '\0')) {
    iVar7 = apiHandleError(db,iVar6);
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar7;
}

Assistant:

SQLITE_API int sqlite3_load_extension(
  sqlite3 *db,          /* Load the extension into this database connection */
  const char *zFile,    /* Name of the shared library containing extension */
  const char *zProc,    /* Entry point.  Use "sqlite3_extension_init" if 0 */
  char **pzErrMsg       /* Put error message here if not 0 */
){
  int rc;
  sqlite3_mutex_enter(db->mutex);
  rc = sqlite3LoadExtension(db, zFile, zProc, pzErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}